

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,bool clean,bool fast,
          bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 uVar1;
  bool bVar2;
  int __errnum;
  uint uVar3;
  char *pcVar4;
  reference pvVar5;
  GeneratedMakeCommand *pGVar6;
  size_type sVar7;
  cmake *this_00;
  pointer command_00;
  cmState *this_01;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  rep local_288;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_280;
  string local_278;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_258;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_250;
  iterator command;
  string makeCommandStr;
  string local_220;
  rep local_200;
  cmListFileBacktrace local_1f8;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17b;
  undefined1 local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  iterator local_150;
  size_type local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_128 [8];
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string *outputPtr;
  string outputBuffer;
  int retVal;
  undefined1 local_c0 [8];
  string err;
  undefined1 local_90 [8];
  cmWorkingDirectory workdir;
  bool hideconsole;
  bool verbose_local;
  bool fast_local;
  bool clean_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *projectName_local;
  string *bindir_local;
  string *param_2_local;
  int jobs_local;
  cmGlobalGenerator *this_local;
  cmDuration timeout_local;
  
  workdir._39_1_ = clean;
  workdir._38_1_ = fast;
  workdir._37_1_ = verbose;
  workdir._36_1_ = cmSystemTools::GetRunCommandHideConsole();
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_90,bindir);
  std::__cxx11::string::operator+=((string *)output,"Change Dir: ");
  std::__cxx11::string::operator+=((string *)output,(string *)bindir);
  std::__cxx11::string::operator+=((string *)output,"\n");
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_90);
  if (bVar2) {
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,"Failed to change directory: ",
               (allocator<char> *)((long)&retVal + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&retVal + 3));
    __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_90);
    pcVar4 = strerror(__errnum);
    std::__cxx11::string::operator+=((string *)local_c0,pcVar4);
    cmSystemTools::Error((string *)local_c0);
    std::__cxx11::string::operator+=((string *)output,(string *)local_c0);
    std::__cxx11::string::operator+=((string *)output,"\n");
    timeout_local.__r._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_c0);
    goto LAB_001d6f74;
  }
  outputBuffer.field_2._12_4_ = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::__cxx11::string::string((string *)&outputPtr);
  (*this->_vptr_cmGlobalGenerator[0x11])
            (&cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,makeCommandCSTR,projectName,
             bindir,targets,config,(byte)workdir._38_1_ & 1,jobs,(byte)workdir._37_1_ & 1,
             nativeOptions);
  if ((outputflag == OUTPUT_PASSTHROUGH) &&
     (pvVar5 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::back((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)&cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
     ((pvVar5->super_GeneratedMakeCommand).RequiresOutputForward & 1U) != 0)) {
    outputflag = OUTPUT_FORWARD;
  }
  if ((workdir._39_1_ & 1) == 0) {
LAB_001d6bc8:
    std::__cxx11::string::string((string *)&command);
    std::__cxx11::string::operator+=((string *)output,"\nRun Build Command(s):");
    local_250._M_current =
         (GeneratedMakeCommand *)
         std::
         vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
         ::begin((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_258._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_258);
      if (!bVar2) break;
      pGVar6 = &__gnu_cxx::
                __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                ::operator->(&local_250)->super_GeneratedMakeCommand;
      detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_278,pGVar6);
      std::__cxx11::string::operator=((string *)&command,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      local_280._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_280);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)&command," && ");
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&command);
      command_00 = __gnu_cxx::
                   __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                   ::operator->(&local_250);
      local_288 = timeout.__r;
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)command_00,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (!bVar2) {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
        std::operator+(&local_2a8,"Generator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        cmSystemTools::Error(&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::operator+(&local_2e8,"\nGenerator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        std::operator+(&local_2c8,&local_2e8,"\n");
        std::__cxx11::string::operator+=((string *)output,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        timeout_local.__r._4_4_ = 1;
        goto LAB_001d6f24;
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
      ::operator++(&local_250);
    }
    std::__cxx11::string::operator+=((string *)output,"\n");
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
    this_01 = cmake::GetState(this->CMakeInstance);
    bVar2 = cmState::UseWatcomWMake(this_01);
    if (((bVar2) && (outputBuffer.field_2._12_4_ == 0)) &&
       (lVar8 = std::__cxx11::string::find((char *)output,0x89fbdc), lVar8 != -1)) {
      outputBuffer.field_2._12_4_ = 1;
    }
    timeout_local.__r._4_4_ = outputBuffer.field_2._12_4_;
LAB_001d6f24:
    std::__cxx11::string::~string((string *)&command);
  }
  else {
    local_17a = 1;
    local_178 = &local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"clean",&local_179);
    local_17a = 0;
    local_150 = &local_170;
    local_148 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_17b);
    __l._M_len = local_148;
    __l._M_array = local_150;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_140,__l,&local_17b);
    uVar1 = workdir._37_1_;
    uVar3 = (uint)(byte)workdir._38_1_;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_198);
    (*this->_vptr_cmGlobalGenerator[0x11])
              (local_128,this,makeCommandCSTR,projectName,bindir,&local_140,config,uVar3 & 1,jobs,
               (byte)uVar1 & 1,&local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_140);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_17b);
    local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
    do {
      local_368 = local_368 + -1;
      std::__cxx11::string::~string((string *)local_368);
    } while (local_368 != &local_170);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::operator+=((string *)output,"\nRun Clean Command:");
    pGVar6 = &std::
              vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)local_128)->super_GeneratedMakeCommand;
    detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_1b8,pGVar6);
    std::__cxx11::string::operator+=((string *)output,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::operator+=((string *)output,"\n");
    sVar7 = std::
            vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ::size((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                    *)local_128);
    if (sVar7 == 1) {
      pvVar5 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                        *)local_128);
      local_200 = timeout.__r;
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pvVar5,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        bVar2 = false;
      }
      else {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"Generator: execution of make clean failed.",
                   (allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        cmSystemTools::Error(&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::__cxx11::string::operator+=
                  ((string *)output,"\nGenerator: execution of make clean failed.\n");
        timeout_local.__r._4_4_ = 1;
        bVar2 = true;
      }
    }
    else {
      this_00 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 &local_1d9);
      local_1f8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1f8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_1f8);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_1d8,&local_1f8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      timeout_local.__r._4_4_ = 1;
      bVar2 = true;
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)local_128);
    if (!bVar2) goto LAB_001d6bc8;
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
             *)&cleanCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&outputPtr);
LAB_001d6f74:
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_90);
  return timeout_local.__r._4_4_;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, bool clean, bool fast, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = "Failed to change directory: ";
    err += std::strerror(workdir.GetLastResult());
    cmSystemTools::Error(err);
    output += err;
    output += "\n";
    return 1;
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand =
    this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir, targets,
                               config, fast, jobs, verbose, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, config, fast, jobs, verbose);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  for (auto command = makeCommand.begin(); command != makeCommand.end();
       ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}